

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::force_recheck(torrent *this)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  element_type *peVar4;
  bool in;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_code local_88;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  
  if (((0 < (((this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length) &&
      (((uVar3 = *(ulong *)&(this->super_torrent_hot_members).field_0x48,
        (uVar3 & 0xe00000008000000) != 0x200000000000000 || ((uVar3 & 0x14000000) != 0)) ||
       ((this->m_error).failed_ != false)))) && ((~uVar3 & 0xe00000000000000) != 0)) {
    clear_error(this);
    local_88 = errors::make_error_code(stopping_torrent);
    disconnect_all(this,&local_88,bittorrent);
    stop_announcing(this);
    leave_seed_mode(this,skip_checking);
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 & 0xbf;
    this_00._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_00._M_head_impl != (piece_picker *)0x0) {
      peVar4 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      piece_picker::resize
                (this_00._M_head_impl,(peVar4->m_files).m_total_size,
                 (peVar4->m_files).m_piece_length);
      aux::file_progress::clear(&this->m_file_progress);
      aux::file_progress::init
                (&this->m_file_progress,
                 (EVP_PKEY_CTX *)
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
    }
    this->field_0x5c0 = this->field_0x5c0 & 0xf7;
    update_gauge(this);
    in = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,in);
    set_state(this,checking_resume_data);
    set_queue_position(this,(queue_position_t)0x7fffffff);
    ::std::
    __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
    ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             *)&this->m_add_torrent_params,(pointer)0x0);
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    local_38 = 0;
    uStack_30 = 0;
    local_28 = (code *)0x0;
    uStack_20 = 0;
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
              ((long *)CONCAT44(extraout_var,iVar5),(this->m_storage).m_idx.m_val);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,3);
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [4])();
    uVar2 = (this->m_storage).m_idx.m_val;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_88,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78 = (undefined8 *)0x0;
    uStack_70 = 0;
    local_78 = (undefined8 *)operator_new(0x10);
    *local_78 = local_88._0_8_;
    local_78[1] = 0;
    local_78[1] = local_88.cat_;
    local_88 = (error_code)ZEXT816(0);
    pcStack_60 = ::std::
                 _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2354:10)>
                 ::_M_invoke;
    local_68 = ::std::
               _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2354:10)>
               ::_M_manager;
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x40))
              ((long *)CONCAT44(extraout_var_00,iVar5),uVar2,0,&local_58);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.cat_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.cat_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  return;
}

Assistant:

piece_refcount(piece_picker& p, piece_index_t piece)
			: m_picker(p)
			, m_piece(piece)
		{
			m_picker.inc_refcount(m_piece, nullptr);
		}